

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iHeight)

{
  RtreeDValue *aDistance;
  undefined8 *puVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  u8 uVar5;
  byte bVar6;
  i64 iVar7;
  i64 iVar8;
  i64 iVar9;
  i64 iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  RtreeCell *aCell;
  RtreeNode *pNode_00;
  RtreeNode *pRVar19;
  ulong uVar20;
  void *__s;
  i64 iVar21;
  u8 *puVar22;
  int iVar23;
  RtreeCoord *pRVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  RtreeCell *pRVar28;
  RtreeNode *pRVar29;
  int *piVar30;
  void *pvVar31;
  RtreeNode *pParent;
  ulong uVar32;
  u64 n;
  long lVar33;
  i64 *piVar34;
  bool bVar35;
  RtreeDValue RVar36;
  RtreeDValue RVar37;
  double dVar38;
  RtreeDValue RVar39;
  RtreeDValue RVar40;
  undefined1 auVar41 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  RtreeCell leftbbox;
  RtreeCell rightbbox;
  long local_188;
  int local_14c;
  ulong local_120;
  int local_ec;
  undefined1 local_e8 [12];
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  RtreeCoord aRStack_c0 [2];
  undefined1 local_b8 [16];
  long local_a8;
  double local_a0;
  undefined1 local_98 [56];
  ulong local_60;
  ulong local_58;
  double local_50;
  ulong local_48;
  RtreeCell *local_40;
  RtreeCell *local_38;
  long lVar42;
  
  if (0 < iHeight) {
    uVar32 = pCell->iRowid;
    iVar16 = (int)((uVar32 & 0xffffffff) * 0x51d07eaf >> 0x20);
    for (pRVar19 = pRtree->aHash
                   [(int)uVar32 + (((uint)((int)uVar32 - iVar16) >> 1) + iVar16 >> 6) * -0x61];
        pRVar19 != (RtreeNode *)0x0; pRVar19 = pRVar19->pNext) {
      if (pRVar19->iNode == uVar32) {
        nodeRelease(pRtree,pRVar19->pParent);
        if (pNode != (RtreeNode *)0x0) {
          pNode->nRef = pNode->nRef + 1;
        }
        pRVar19->pParent = pNode;
        break;
      }
    }
  }
  iVar16 = nodeInsertCell(pRtree,pNode,pCell);
  if (iVar16 == 0) {
    iVar16 = AdjustTree(pRtree,pNode,pCell);
    if (iVar16 != 0) {
      return iVar16;
    }
    if (iHeight != 0) {
      iVar16 = parentWrite(pRtree,pCell->iRowid,pNode->iNode);
      return iVar16;
    }
    iVar16 = rowidWrite(pRtree,pCell->iRowid,pNode->iNode);
    return iVar16;
  }
  if ((pRtree->iReinsertHeight < iHeight) && (pNode->iNode != 1)) {
    pRtree->iReinsertHeight = iHeight;
    local_d8._0_4_ = (RtreeCoord)0x0;
    local_d8._4_4_ = (RtreeCoord)0x0;
    uStack_d0._0_4_ = (RtreeCoord)0x0;
    uStack_d0._4_4_ = (RtreeCoord)0x0;
    local_e8._0_8_ = 0;
    local_e8._8_4_ = (RtreeCoord)0x0;
    fStack_dc = 0.0;
    local_c8._0_4_ = (RtreeCoord)0x0;
    local_c8._4_4_ = (RtreeCoord)0x0;
    bVar3 = pNode->zData[2];
    bVar4 = pNode->zData[3];
    iVar16 = sqlite3_initialize();
    if (iVar16 != 0) {
      return 7;
    }
    iVar23 = (uint)bVar3 * 0x100;
    uVar17 = iVar23 + (uint)bVar4 + 2 & 0xfffffffe;
    aCell = (RtreeCell *)sqlite3Malloc((ulong)(uVar17 << 6));
    if (aCell == (RtreeCell *)0x0) {
      return 7;
    }
    uVar26 = (uint)CONCAT11(bVar3,bVar4);
    iVar16 = iVar23 + 1 + (uint)bVar4;
    piVar30 = (int *)((long)aCell->aCoord + ((ulong)(uVar17 * 0x30) - 8));
    uVar32 = (ulong)(CONCAT11(bVar3,bVar4) + 1);
    piVar34 = (i64 *)((long)aCell->aCoord + ((ulong)(uVar26 * 0x30) - 8));
    local_b8._0_8_ = aCell->aCoord + 1;
    uVar25 = 0;
    do {
      while( true ) {
        if (uVar25 == uVar26) {
          iVar21 = pCell->iRowid;
          iVar7 = *(i64 *)pCell->aCoord;
          iVar8 = *(i64 *)(pCell->aCoord + 2);
          iVar9 = *(i64 *)(pCell->aCoord + 4);
          iVar10 = *(i64 *)(pCell->aCoord + 8);
          piVar34[4] = *(i64 *)(pCell->aCoord + 6);
          piVar34[5] = iVar10;
          piVar34[2] = iVar8;
          piVar34[3] = iVar9;
          *piVar34 = iVar21;
          piVar34[1] = iVar7;
        }
        else {
          nodeGetCell(pRtree,(RtreeNode *)pNode->zData,(int)uVar25,aCell + uVar25);
        }
        piVar30[uVar25] = (int)uVar25;
        uVar20 = (ulong)pRtree->nDim;
        if (uVar20 == 0) break;
        uVar5 = pRtree->eCoordType;
        lVar33 = uVar25 * 0x30 + local_b8._0_8_;
        uVar27 = 0;
        do {
          if (uVar5 == '\0') {
            dVar45 = *(double *)(local_e8 + (uVar27 * 2 + -2) * 4 + 8) +
                     (double)*(float *)(lVar33 + -4 + uVar27 * 8);
            *(double *)(local_e8 + (uVar27 * 2 + -2) * 4 + 8) = dVar45;
            dVar44 = (double)*(float *)(lVar33 + uVar27 * 8);
          }
          else {
            dVar45 = *(double *)(local_e8 + (uVar27 * 2 + -2) * 4 + 8) +
                     (double)*(int *)(lVar33 + -4 + uVar27 * 8);
            *(double *)(local_e8 + (uVar27 * 2 + -2) * 4 + 8) = dVar45;
            dVar44 = (double)*(int *)(lVar33 + uVar27 * 8);
          }
          *(double *)(local_e8 + (uVar27 * 2 + -2) * 4 + 8) = dVar45 + dVar44;
          uVar27 = uVar27 + 1;
        } while (uVar20 != uVar27);
        uVar25 = uVar25 + 1;
        if (uVar25 == uVar32) {
          if (uVar20 != 0) {
            uVar25 = 0;
            do {
              *(double *)(local_e8 + (uVar25 * 2 + -2) * 4 + 8) =
                   *(double *)(local_e8 + (uVar25 * 2 + -2) * 4 + 8) / (double)(iVar16 * 2);
              uVar25 = uVar25 + 1;
            } while (uVar20 != uVar25);
          }
          goto LAB_001ccc0f;
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar32);
LAB_001ccc0f:
    aDistance = (RtreeDValue *)(piVar30 + uVar17 + uVar17);
    pRVar24 = aCell->aCoord;
    uVar25 = 0;
    do {
      aDistance[uVar25] = 0.0;
      if (uVar20 != 0) {
        uVar5 = pRtree->eCoordType;
        dVar45 = 0.0;
        uVar27 = 0;
        do {
          if (uVar5 == '\0') {
            dVar44 = (double)(float)*(undefined8 *)(pRVar24 + uVar27 * 2);
            dVar38 = (double)(float)((ulong)*(undefined8 *)(pRVar24 + uVar27 * 2) >> 0x20);
          }
          else {
            dVar44 = (double)(int)*(undefined8 *)(pRVar24 + uVar27 * 2);
            dVar38 = (double)(int)((ulong)*(undefined8 *)(pRVar24 + uVar27 * 2) >> 0x20);
          }
          dVar44 = (dVar38 - dVar44) - *(double *)(local_e8 + (uVar27 * 2 + -2) * 4 + 8);
          dVar45 = dVar45 + dVar44 * dVar44;
          aDistance[uVar25] = dVar45;
          uVar27 = uVar27 + 1;
        } while (uVar20 != uVar27);
      }
      uVar25 = uVar25 + 1;
      pRVar24 = pRVar24 + 0xc;
    } while (uVar25 != uVar32);
    SortByDistance(piVar30,iVar16,aDistance,piVar30 + uVar17);
    uVar32 = 0;
    memset(pNode->zData + 2,0,(long)pRtree->iNodeSize - 2);
    pNode->isDirty = 1;
    do {
      iVar16 = (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell;
      iVar16 = (int)((ulong)((long)iVar16 * 0x55555555) >> 0x20) - iVar16;
      if ((long)(int)(((iVar16 >> 1) - (iVar16 >> 0x1f)) + uVar26) <= (long)uVar32) {
        iVar16 = fixBoundingBox(pRtree,pNode);
        if ((iVar16 == 0) && ((uint)uVar32 <= uVar26)) {
          goto LAB_001cd390;
        }
        break;
      }
      iVar16 = aCell[(ulong)(CONCAT11(bVar3,bVar4) + 2 >> 1) * 2].aCoord[uVar32 - 2].i;
      nodeInsertCell(pRtree,pNode,aCell + iVar16);
      lVar33 = aCell[iVar16].iRowid;
      iVar16 = 0;
      if (lVar33 == pCell->iRowid) {
        if (iHeight == 0) {
          iVar16 = rowidWrite(pRtree,lVar33,pNode->iNode);
        }
        else {
          iVar16 = parentWrite(pRtree,lVar33,pNode->iNode);
        }
      }
      uVar32 = uVar32 + 1;
    } while (iVar16 == 0);
    goto LAB_001ccbb1;
  }
  bVar3 = pNode->zData[2];
  bVar4 = pNode->zData[3];
  iVar16 = sqlite3_initialize();
  if (iVar16 == 0) {
    uVar17 = (uint)bVar3 * 0x100 + (uint)bVar4 + 1;
    aCell = (RtreeCell *)sqlite3Malloc((ulong)uVar17 * 0x34);
    if (aCell == (RtreeCell *)0x0) goto LAB_001cc7a3;
    uVar26 = (uint)CONCAT11(bVar3,bVar4);
    memset((void *)((long)aCell->aCoord + ((ulong)(uVar17 * 0x30) - 8)),0,(ulong)(uVar17 * 4));
    if (uVar26 != 0) {
      uVar32 = 0;
      pRVar28 = aCell;
      do {
        nodeGetCell(pRtree,(RtreeNode *)pNode->zData,(int)uVar32,pRVar28);
        uVar32 = uVar32 + 1;
        pRVar28 = pRVar28 + 1;
      } while (CONCAT11(bVar3,bVar4) != uVar32);
    }
    memset(pNode->zData + 2,0,(long)pRtree->iNodeSize - 2);
    pNode->isDirty = 1;
    uVar32 = (ulong)(uVar26 * 0x30);
    iVar21 = pCell->iRowid;
    iVar7 = *(i64 *)pCell->aCoord;
    uVar11 = *(undefined8 *)(pCell->aCoord + 2);
    uVar12 = *(undefined8 *)(pCell->aCoord + 4);
    uVar13 = *(undefined8 *)(pCell->aCoord + 8);
    puVar1 = (undefined8 *)((long)aCell->aCoord + uVar32 + 0x18);
    *puVar1 = *(undefined8 *)(pCell->aCoord + 6);
    puVar1[1] = uVar13;
    puVar1 = (undefined8 *)((long)aCell->aCoord + uVar32 + 8);
    *puVar1 = uVar11;
    puVar1[1] = uVar12;
    piVar34 = (i64 *)((long)aCell->aCoord + (uVar32 - 8));
    *piVar34 = iVar21;
    piVar34[1] = iVar7;
    if (pNode->iNode == 1) {
      pNode_00 = nodeNew(pRtree,pNode);
      pRVar19 = nodeNew(pRtree,pNode);
      iVar16 = pRtree->iDepth + 1;
      pRtree->iDepth = iVar16;
      pNode->isDirty = 1;
      uVar15 = (ushort)iVar16;
      *(ushort *)pNode->zData = uVar15 << 8 | uVar15 >> 8;
    }
    else {
      pNode_00 = nodeNew(pRtree,pNode->pParent);
      pNode->nRef = pNode->nRef + 1;
      pRVar19 = pNode;
    }
    if (pNode_00 == (RtreeNode *)0x0 || pRVar19 == (RtreeNode *)0x0) goto LAB_001ccb93;
    memset(pRVar19->zData,0,(long)pRtree->iNodeSize);
    memset(pNode_00->zData,0,(long)pRtree->iNodeSize);
    bVar6 = pRtree->nDim;
    iVar16 = sqlite3_initialize();
    if (iVar16 != 0) goto LAB_001ccb93;
    n = ((ulong)(uVar17 * 4) + 8) * ((ulong)bVar6 + 1);
    __s = sqlite3Malloc(n);
    if (__s == (void *)0x0) goto LAB_001ccb93;
    bVar6 = pRtree->nDim;
    memset(__s,0,n);
    bVar14 = pRtree->nDim;
    if (bVar14 == 0) {
      local_188 = 0;
      uVar32 = 0;
    }
    else {
      auVar47._2_6_ = 0;
      auVar47._0_2_ = CONCAT11(bVar3,bVar4);
      auVar47._8_2_ = CONCAT11(bVar3,bVar4);
      auVar47._10_6_ = 0;
      uVar32 = 0;
      local_b8 = auVar47 | _DAT_001d4f80;
      pvVar31 = __s;
      do {
        auVar47 = _DAT_001d4f80;
        lVar33 = (ulong)bVar14 * 8;
        piVar30 = (int *)((long)__s + uVar32 * uVar17 * 4 + lVar33);
        *(int **)((long)__s + uVar32 * 8) = piVar30;
        uVar25 = 0;
        auVar41 = _DAT_001df110;
        do {
          bVar35 = local_b8._0_4_ < SUB164(auVar41 ^ auVar47,0);
          iVar16 = SUB164(auVar41 ^ auVar47,4);
          iVar23 = local_b8._4_4_;
          if ((bool)(~(iVar23 < iVar16 || iVar16 == iVar23 && bVar35) & 1)) {
            *(int *)((long)pvVar31 + uVar25 * 4 + lVar33) = (int)uVar25;
          }
          if (iVar23 >= iVar16 && (iVar16 != iVar23 || !bVar35)) {
            *(int *)((long)pvVar31 + uVar25 * 4 + lVar33 + 4) = (int)uVar25 + 1;
          }
          uVar25 = uVar25 + 2;
          lVar42 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 2;
          auVar41._8_8_ = lVar42 + 2;
        } while ((CONCAT11(bVar3,bVar4) + 2 & 0xfffffffe) != uVar25);
        SortByDimension(pRtree,piVar30,uVar17,(int)uVar32,aCell,
                        (int *)((long)__s + (ulong)(bVar6 * uVar17) * 4 + (ulong)bVar6 * 8));
        uVar32 = uVar32 + 1;
        bVar14 = pRtree->nDim;
        local_58 = (ulong)bVar14;
        pvVar31 = (void *)((long)pvVar31 + (ulong)((uint)CONCAT11(bVar3,bVar4) * 4 + 4));
      } while (uVar32 < local_58);
      uVar32 = 0;
      if (bVar14 == 0) {
        local_188 = 0;
      }
      else {
        iVar16 = (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell;
        local_60 = (ulong)(uint)(iVar16 / 3);
        iVar23 = (int)((ulong)((long)iVar16 * 0x55555555) >> 0x20) - iVar16;
        iVar23 = (iVar23 >> 1) - (iVar23 >> 0x1f);
        local_a8 = (long)(iVar16 / 3);
        local_120 = 0;
        iVar16 = 0;
        dVar45 = 0.0;
        do {
          local_14c = 0;
          dVar44 = 0.0;
          local_50 = dVar45;
          local_48 = uVar32;
          if ((int)local_60 <= (int)(iVar23 + uVar17)) {
            piVar30 = *(int **)((long)__s + local_120 * 8);
            local_38 = aCell + *piVar30;
            local_40 = aCell + piVar30[uVar26];
            local_a0 = 0.0;
            local_14c = 0;
            auVar46 = (undefined1  [16])0x0;
            lVar33 = local_a8;
            do {
              local_b8._0_8_ = auVar46._0_8_;
              local_e8._0_8_ = local_38->iRowid;
              unique0x10000b17 = *(undefined8 *)local_38->aCoord;
              local_d8 = *(undefined8 *)(local_38->aCoord + 2);
              uStack_d0 = *(undefined8 *)(local_38->aCoord + 4);
              local_c8 = *(undefined8 *)(local_38->aCoord + 6);
              aRStack_c0 = *(RtreeCoord (*) [2])(local_38->aCoord + 8);
              local_98._0_8_ = local_40->iRowid;
              local_98._8_8_ = *(undefined8 *)local_40->aCoord;
              local_98._16_8_ = *(undefined8 *)(local_40->aCoord + 2);
              local_98._24_8_ = *(undefined8 *)(local_40->aCoord + 4);
              local_98._32_16_ = *(undefined1 (*) [16])(local_40->aCoord + 6);
              if (1 < uVar26) {
                uVar32 = 1;
                do {
                  pRVar28 = (RtreeCell *)local_98;
                  if ((long)uVar32 < lVar33) {
                    pRVar28 = (RtreeCell *)local_e8;
                  }
                  cellUnion(pRtree,pRVar28,aCell + piVar30[uVar32]);
                  uVar32 = uVar32 + 1;
                } while (uVar26 != uVar32);
              }
              RVar36 = cellMargin(pRtree,(RtreeCell *)local_e8);
              RVar37 = cellMargin(pRtree,(RtreeCell *)local_98);
              dVar45 = 1.0;
              if ((ulong)pRtree->nDim2 != 0) {
                uVar32 = 0;
                dVar45 = 1.0;
                do {
                  if (pRtree->eCoordType == '\0') {
                    fVar2 = *(float *)(local_e8 + uVar32 * 4 + 8);
                    if (*(float *)(local_e8 + uVar32 * 4 + 8) <=
                        *(float *)(local_98 + uVar32 * 4 + 8)) {
                      fVar2 = *(float *)(local_98 + uVar32 * 4 + 8);
                    }
                    dVar38 = (double)fVar2;
                    if (*(float *)(local_98 + uVar32 * 4 + 0xc) <=
                        *(float *)(local_e8 + uVar32 * 4 + 0xc)) {
                      dVar43 = (double)*(float *)(local_98 + uVar32 * 4 + 0xc);
                    }
                    else {
                      dVar43 = (double)*(float *)(local_e8 + uVar32 * 4 + 0xc);
                    }
                  }
                  else {
                    iVar18 = *(int *)(local_98 + uVar32 * 4 + 8);
                    if (*(int *)(local_98 + uVar32 * 4 + 8) < *(int *)(local_e8 + uVar32 * 4 + 8)) {
                      iVar18 = *(int *)(local_e8 + uVar32 * 4 + 8);
                    }
                    dVar38 = (double)iVar18;
                    dVar43 = (double)*(int *)(local_98 + uVar32 * 4 + 0xc);
                    if ((double)*(int *)(local_e8 + uVar32 * 4 + 0xc) <
                        (double)*(int *)(local_98 + uVar32 * 4 + 0xc)) {
                      dVar43 = (double)*(int *)(local_e8 + uVar32 * 4 + 0xc);
                    }
                  }
                  if (dVar43 < dVar38) {
                    dVar45 = 0.0;
                    break;
                  }
                  dVar45 = dVar45 * (dVar43 - dVar38);
                  uVar32 = uVar32 + 2;
                } while (uVar32 < pRtree->nDim2);
                dVar45 = dVar45 + 0.0;
              }
              RVar39 = cellArea(pRtree,(RtreeCell *)local_e8);
              RVar40 = cellArea(pRtree,(RtreeCell *)local_98);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_b8._0_8_;
              if ((lVar33 == local_a8) || (dVar45 < (double)local_b8._0_8_)) {
LAB_001cd294:
                auVar46._8_8_ = 0;
                auVar46._0_8_ = dVar45;
                local_14c = (int)lVar33;
                local_a0 = RVar40 + RVar39;
              }
              else if ((dVar45 == (double)local_b8._0_8_) &&
                      ((!NAN(dVar45) && !NAN((double)local_b8._0_8_) && (RVar40 + RVar39 < local_a0)
                       ))) goto LAB_001cd294;
              dVar44 = dVar44 + RVar36 + RVar37;
              lVar33 = lVar33 + 1;
            } while (iVar23 + uVar17 + 1 != (int)lVar33);
          }
          uVar25 = local_48;
          dVar45 = local_50;
          if (dVar44 < local_50 || local_120 == 0) {
            uVar25 = local_120;
            dVar45 = dVar44;
            iVar16 = local_14c;
          }
          uVar32 = uVar25 & 0xffffffff;
          local_120 = local_120 + 1;
        } while (local_120 != local_58);
        local_188 = (long)(int)uVar25;
        uVar32 = (ulong)iVar16;
      }
    }
    piVar30 = *(int **)((long)__s + local_188 * 8);
    iVar16 = *piVar30;
    local_e8._0_8_ = aCell[iVar16].iRowid;
    unique0x10000bb7 = *(undefined8 *)aCell[iVar16].aCoord;
    local_d8 = *(undefined8 *)(aCell[iVar16].aCoord + 2);
    uStack_d0 = *(undefined8 *)(aCell[iVar16].aCoord + 2 + 2);
    local_c8 = *(undefined8 *)(aCell[iVar16].aCoord + 6);
    aRStack_c0 = *(RtreeCoord (*) [2])(aCell[iVar16].aCoord + 6 + 2);
    iVar16 = piVar30[uVar32];
    local_98._0_8_ = aCell[iVar16].iRowid;
    local_98._8_8_ = *(undefined8 *)aCell[iVar16].aCoord;
    local_98._16_8_ = *(undefined8 *)(aCell[iVar16].aCoord + 2);
    local_98._24_8_ = *(undefined8 *)(aCell[iVar16].aCoord + 2 + 2);
    local_98._32_16_ = *(undefined1 (*) [16])(aCell[iVar16].aCoord + 6);
    uVar25 = 0;
    do {
      pRVar29 = pNode_00;
      if ((long)uVar25 < (long)uVar32) {
        pRVar29 = pRVar19;
      }
      pRVar28 = (RtreeCell *)local_98;
      if ((long)uVar25 < (long)uVar32) {
        pRVar28 = (RtreeCell *)local_e8;
      }
      iVar16 = *(int *)(*(long *)((long)__s + local_188 * 8) + uVar25 * 4);
      nodeInsertCell(pRtree,pRVar29,aCell + iVar16);
      cellUnion(pRtree,pRVar28,aCell + iVar16);
      uVar25 = uVar25 + 1;
    } while (CONCAT11(bVar3,bVar4) + 1 != uVar25);
    sqlite3_free(__s);
    iVar16 = nodeWrite(pRtree,pNode_00);
    if (iVar16 == 0) {
      lVar33 = pRVar19->iNode;
      if (lVar33 == 0) {
        iVar16 = nodeWrite(pRtree,pRVar19);
        if (iVar16 != 0) goto LAB_001ccb98;
        lVar33 = pRVar19->iNode;
      }
      local_98._0_8_ = pNode_00->iNode;
      pRVar29 = pRVar19->pParent;
      local_e8._0_8_ = lVar33;
      if (pNode->iNode == 1) {
        iVar16 = rtreeInsertCell(pRtree,pRVar29,(RtreeCell *)local_e8,iHeight + 1);
      }
      else {
        if (pRVar29 == (RtreeNode *)0x0) {
          local_ec = -1;
        }
        else {
          iVar16 = nodeRowidIndex(pRtree,(RtreeNode *)pRVar29->zData,lVar33,&local_ec);
          if (iVar16 != 0) goto LAB_001ccb98;
        }
        nodeOverwriteCell(pRtree,pRVar29,(RtreeCell *)local_e8,local_ec);
        iVar16 = AdjustTree(pRtree,pRVar29,(RtreeCell *)local_e8);
      }
      if ((iVar16 == 0) &&
         (iVar16 = rtreeInsertCell(pRtree,pNode_00->pParent,(RtreeCell *)local_98,iHeight + 1),
         iVar16 == 0)) {
        puVar22 = pNode_00->zData;
        if ((*(ushort *)(puVar22 + 2) & 0xff) == 0 && *(ushort *)(puVar22 + 2) >> 8 == 0) {
          if (pNode->iNode == 1) goto LAB_001cd71c;
LAB_001cd793:
          iVar16 = updateMapping(pRtree,pCell->iRowid,pRVar19,iHeight);
          if (iVar16 == 0) goto LAB_001cd7b3;
        }
        else {
          uVar17 = 0;
          bVar35 = false;
          do {
            iVar21 = readInt64(puVar22 + (ulong)(pRtree->nBytesPerCell * uVar17) + 4);
            iVar16 = updateMapping(pRtree,iVar21,pNode_00,iHeight);
            if (iVar16 != 0) goto LAB_001ccb98;
            if (iVar21 == pCell->iRowid) {
              bVar35 = true;
            }
            uVar17 = uVar17 + 1;
            puVar22 = pNode_00->zData;
          } while (uVar17 < (ushort)(*(ushort *)(puVar22 + 2) << 8 | *(ushort *)(puVar22 + 2) >> 8))
          ;
          if (pNode->iNode == 1) {
LAB_001cd71c:
            puVar22 = pRVar19->zData;
            if ((*(ushort *)(puVar22 + 2) & 0xff) != 0 || *(ushort *)(puVar22 + 2) >> 8 != 0) {
              uVar17 = 0;
              do {
                iVar21 = readInt64(puVar22 + (ulong)(pRtree->nBytesPerCell * uVar17) + 4);
                iVar16 = updateMapping(pRtree,iVar21,pRVar19,iHeight);
                if (iVar16 != 0) goto LAB_001ccb98;
                uVar17 = uVar17 + 1;
                puVar22 = pRVar19->zData;
              } while (uVar17 < (ushort)(*(ushort *)(puVar22 + 2) << 8 |
                                        *(ushort *)(puVar22 + 2) >> 8));
            }
          }
          else if (!bVar35) goto LAB_001cd793;
LAB_001cd7b3:
          iVar16 = nodeRelease(pRtree,pNode_00);
          if (iVar16 == 0) {
            iVar16 = nodeRelease(pRtree,pRVar19);
            pRVar19 = (RtreeNode *)0x0;
          }
          pNode_00 = (RtreeNode *)0x0;
        }
      }
    }
  }
  else {
LAB_001cc7a3:
    aCell = (RtreeCell *)0x0;
    pRVar19 = (RtreeNode *)0x0;
    pNode_00 = (RtreeNode *)0x0;
LAB_001ccb93:
    iVar16 = 7;
  }
LAB_001ccb98:
  nodeRelease(pRtree,pNode_00);
  nodeRelease(pRtree,pRVar19);
LAB_001ccbb1:
  sqlite3_free(aCell);
  return iVar16;
LAB_001cd390:
  iVar18 = aCell[(ulong)(iVar23 + (uint)bVar4 + 2 >> 1) * 2].aCoord[uVar32 - 2].i;
  iVar16 = ChooseLeaf(pRtree,aCell + iVar18,iHeight,(RtreeNode **)local_98);
  uVar11 = local_98._0_8_;
  if (iVar16 != 0) goto LAB_001ccbb1;
  iVar18 = rtreeInsertCell(pRtree,(RtreeNode *)local_98._0_8_,aCell + iVar18,iHeight);
  iVar16 = nodeRelease(pRtree,(RtreeNode *)uVar11);
  if (iVar18 != 0) {
    iVar16 = iVar18;
  }
  if ((iVar16 != 0) || (bVar35 = uVar26 <= uVar32, uVar32 = uVar32 + 1, bVar35)) goto LAB_001ccbb1;
  goto LAB_001cd390;
}

Assistant:

static int rtreeInsertCell(
  Rtree *pRtree,
  RtreeNode *pNode,
  RtreeCell *pCell,
  int iHeight
){
  int rc = SQLITE_OK;
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, pCell->iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( nodeInsertCell(pRtree, pNode, pCell) ){
    if( iHeight<=pRtree->iReinsertHeight || pNode->iNode==1){
      rc = SplitNode(pRtree, pNode, pCell, iHeight);
    }else{
      pRtree->iReinsertHeight = iHeight;
      rc = Reinsert(pRtree, pNode, pCell, iHeight);
    }
  }else{
    rc = AdjustTree(pRtree, pNode, pCell);
    if( rc==SQLITE_OK ){
      if( iHeight==0 ){
        rc = rowidWrite(pRtree, pCell->iRowid, pNode->iNode);
      }else{
        rc = parentWrite(pRtree, pCell->iRowid, pNode->iNode);
      }
    }
  }
  return rc;
}